

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicswidget_p.cpp
# Opt level: O0

void __thiscall QGraphicsWidgetPrivate::setGeometryFromSetPos(QGraphicsWidgetPrivate *this)

{
  QGraphicsWidget *this_00;
  QGraphicsWidgetPrivate *in_RDI;
  long in_FS_OFFSET;
  QGraphicsWidget *q;
  QSizeF *asize;
  undefined1 local_28 [32];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  if ((*(ushort *)&in_RDI->field_0x1b4 >> 10 & 1) == 0) {
    this_00 = q_func(in_RDI);
    *(ushort *)&in_RDI->field_0x1b4 = *(ushort *)&in_RDI->field_0x1b4 & 0xefff | 0x1000;
    asize = (QSizeF *)&(in_RDI->super_QGraphicsItemPrivate).pos;
    QGraphicsWidget::size(this_00);
    QRectF::QRectF((QRectF *)in_RDI,(QPointF *)this_00,asize);
    (**(code **)(*(long *)&this_00->super_QGraphicsObject + 0x60))(this_00,local_28);
    *(ushort *)&in_RDI->field_0x1b4 = *(ushort *)&in_RDI->field_0x1b4 & 0xefff;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QGraphicsWidgetPrivate::setGeometryFromSetPos()
{
    if (inSetGeometry)
        return;
    Q_Q(QGraphicsWidget);
    inSetPos = 1;
    // Ensure setGeometry is called (avoid recursion when setPos is
    // called from within setGeometry).
    q->setGeometry(QRectF(pos, q->size()));
    inSetPos = 0 ;
}